

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *__n;
  size_t __n_00;
  Branch *pBVar4;
  long lVar5;
  char *pos;
  long lVar6;
  long lVar7;
  size_t elementCount;
  undefined1 local_98 [16];
  long local_88;
  undefined1 local_80 [16];
  size_t local_70;
  ArrayPtr<const_char> *local_60;
  String local_58;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_98._0_8_ = (this->text).content.ptr;
  local_98._8_8_ = params->size_;
  lVar5 = 0;
  local_88 = params_1->size_ - 1;
  if (params_1->size_ == 0) {
    local_88 = lVar5;
  }
  local_80._0_8_ = (params_2->content).size_;
  local_80._8_8_ = params_3->size_;
  local_70 = params_4->size_;
  do {
    lVar6 = lVar6 + *(long *)(local_98 + lVar5 * 8);
    lVar7 = lVar7 + *(long *)(local_98 + lVar5 * 8 + 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  __return_storage_ptr__->size_ = lVar7 + lVar6;
  local_88 = 0;
  lVar6 = 0;
  lVar7 = 0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + *(long *)(local_98 + lVar5 * 8);
    lVar7 = lVar7 + *(long *)(local_98 + lVar5 * 8 + 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  heapString(&local_58,lVar7 + lVar6);
  (__return_storage_ptr__->text).content.ptr = local_58.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_58.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_58.content.disposer;
  lVar6 = 0;
  lVar7 = 0;
  local_98 = (undefined1  [16])0x0;
  local_88 = 1;
  local_80 = (undefined1  [16])0x0;
  local_70 = 0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + *(long *)(local_98 + lVar5 * 8);
    lVar7 = lVar7 + *(long *)(local_98 + lVar5 * 8 + 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  elementCount = lVar7 + lVar6;
  local_60 = params;
  local_40 = (ArrayPtr<const_char> *)params_2;
  local_38 = params_3;
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_58.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_58.content.ptr = (char *)pBVar4;
  local_58.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pos,(void *)this->size_,(size_t)__n);
    pos = pos + (long)__n;
  }
  __n_00 = local_60->size_;
  if (__n_00 != 0) {
    memcpy(pos,local_60->ptr,__n_00);
    pos = pos + __n_00;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(String *)params_1,local_40,local_38,params_4);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}